

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatMap.c
# Opt level: O3

sat_solver * Sbm_AddCardinSolver(int LogN,Vec_Int_t **pvVars)

{
  undefined1 auVar1 [16];
  Vec_Int_t *vVars;
  int *piVar2;
  sat_solver *s;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  int K;
  int iVar7;
  uint uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  uVar8 = 1 << ((byte)LogN & 0x1f);
  iVar3 = (LogN + -1) * (LogN << ((byte)LogN & 0x1f));
  iVar7 = iVar3 + 3;
  if (-1 < iVar3) {
    iVar7 = iVar3;
  }
  iVar7 = (iVar7 >> 2) * 2 + uVar8 * 3 + -2;
  vVars = (Vec_Int_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0x10 < uVar8) {
    uVar4 = uVar8;
  }
  vVars->nCap = uVar4;
  piVar2 = (int *)malloc((long)(int)uVar4 << 2);
  vVars->pArray = piVar2;
  vVars->nSize = uVar8;
  auVar1 = _DAT_0094e250;
  if (LogN != 0x1f) {
    lVar5 = (ulong)uVar8 - 1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_0094e250;
    auVar10 = _DAT_0094e240;
    do {
      auVar11 = auVar10 ^ auVar1;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        piVar2[uVar6] = (int)uVar6;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        piVar2[uVar6 + 1] = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar5 + 2;
    } while ((uVar8 + 1 & 0xfffffffe) != uVar6);
  }
  s = sat_solver_new();
  sat_solver_setnvars(s,iVar7);
  iVar3 = Sbm_AddCardinConstrPairWise(s,vVars,K);
  if (iVar3 == iVar7) {
    *pvVars = vVars;
    return s;
  }
  __assert_fail("nVarsReal == nVarsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSatMap.c"
                ,0x160,"sat_solver *Sbm_AddCardinSolver(int, Vec_Int_t **)");
}

Assistant:

sat_solver * Sbm_AddCardinSolver( int LogN, Vec_Int_t ** pvVars )
{
    int nVars = 1 << LogN;
    int nVarsAlloc = nVars + 2 * (nVars * LogN * (LogN-1) / 4 + nVars - 1), nVarsReal;
    Vec_Int_t * vVars = Vec_IntStartNatural( nVars );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, nVarsAlloc );
    nVarsReal = Sbm_AddCardinConstrPairWise( pSat, vVars, 2 );
    assert( nVarsReal == nVarsAlloc );
    *pvVars = vVars;
    return pSat;
}